

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.c
# Opt level: O0

void parse_option(state_t *state,char *parameters)

{
  int iVar1;
  int local_1c;
  int size_mb;
  char *parameters_local;
  state_t *state_local;
  
  iVar1 = strncmp(parameters,"Hash value ",0xb);
  if (iVar1 == 0) {
    local_1c = parse_int(parameters + 0xb);
    if (local_1c < 1) {
      local_1c = 1;
    }
    else if (0x400 < local_1c) {
      local_1c = 0x400;
    }
    ENGINE_resize_hashtable(state->engine,local_1c);
  }
  return;
}

Assistant:

void parse_option(state_t *state, const char *parameters)
{
    if(strncmp(parameters, "Hash value ", 11) == 0) {
        parameters += 11;
        int size_mb = parse_int(parameters);
        if(size_mb < 1) size_mb = 1;
        else if(size_mb > 1024) size_mb = 1024;
        ENGINE_resize_hashtable(state->engine, size_mb);
    }
}